

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

void Saig_ManBmcSectionsTest(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Vec_t *p_00;
  Vec_Ptr_t *p_01;
  uint local_24;
  int i;
  Vec_Ptr_t *vOne;
  Vec_Vec_t *vSects;
  Aig_Man_t *p_local;
  
  p_00 = Saig_ManBmcSections(p);
  for (local_24 = 0; iVar1 = Vec_VecSize(p_00), (int)local_24 < iVar1; local_24 = local_24 + 1) {
    p_01 = Vec_VecEntry(p_00,local_24);
    uVar2 = Vec_PtrSize(p_01);
    Abc_Print(1,"%d=%d ",(ulong)local_24,(ulong)uVar2);
  }
  Abc_Print(1,"\n");
  Vec_VecFree(p_00);
  return;
}

Assistant:

void Saig_ManBmcSectionsTest( Aig_Man_t * p )
{
    Vec_Vec_t * vSects;
    Vec_Ptr_t * vOne;
    int i;
    vSects = Saig_ManBmcSections( p );
    Vec_VecForEachLevel( vSects, vOne, i )
        Abc_Print( 1, "%d=%d ", i, Vec_PtrSize(vOne) );
    Abc_Print( 1, "\n" );
    Vec_VecFree( vSects );
}